

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int dhm_read_bignum(mbedtls_mpi *X,uchar **p,uchar *end)

{
  uint uVar1;
  int iVar2;
  int n;
  int ret;
  uchar *end_local;
  uchar **p_local;
  mbedtls_mpi *X_local;
  
  if ((long)end - (long)*p < 2) {
    X_local._4_4_ = -0x3080;
  }
  else {
    uVar1 = (uint)CONCAT11(**p,(*p)[1]);
    *p = *p + 2;
    if ((int)end - (int)*p < (int)uVar1) {
      X_local._4_4_ = -0x3080;
    }
    else {
      iVar2 = mbedtls_mpi_read_binary(X,*p,(long)(int)uVar1);
      if (iVar2 == 0) {
        *p = *p + (int)uVar1;
        X_local._4_4_ = 0;
      }
      else {
        X_local._4_4_ = iVar2 + -0x3100;
      }
    }
  }
  return X_local._4_4_;
}

Assistant:

static int dhm_read_bignum( mbedtls_mpi *X,
                            unsigned char **p,
                            const unsigned char *end )
{
    int ret, n;

    if( end - *p < 2 )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    n = ( (*p)[0] << 8 ) | (*p)[1];
    (*p) += 2;

    if( (int)( end - *p ) < n )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = mbedtls_mpi_read_binary( X, *p, n ) ) != 0 )
        return( MBEDTLS_ERR_DHM_READ_PARAMS_FAILED + ret );

    (*p) += n;

    return( 0 );
}